

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

string * units::definedUnitsFromFile(string *__return_storage_ptr__,string *filename)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char cVar4;
  istream *piVar5;
  long lVar6;
  long lVar7;
  mapped_type *pmVar8;
  long *plVar9;
  undefined8 *puVar10;
  long *plVar11;
  ulong *puVar12;
  _Alloc_hider _Var13;
  long lVar14;
  ulong uVar15;
  string userdef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> meas_string;
  string line;
  precise_measurement meas;
  ifstream infile;
  key_type local_328;
  long *local_308;
  long local_300;
  long local_2f8 [2];
  string *local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  long local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  precise_unit local_2c0;
  long local_2b0;
  long lStack_2a8;
  double local_2a0;
  double local_298;
  string local_290;
  long *local_270 [2];
  long local_260 [2];
  precise_measurement local_250;
  long local_238 [65];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_2e8 = __return_storage_ptr__;
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    local_2e0 = &local_2d0;
    local_2d8 = 0;
    local_2d0._M_allocated_capacity = local_2d0._M_allocated_capacity & 0xffffffffffffff00;
LAB_001637b1:
    do {
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_2e0,cVar4);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_00163de8;
      lVar6 = std::__cxx11::string::find_first_not_of((char *)&local_2e0,0x1832ae,0);
      if (lVar6 != -1) {
        cVar4 = local_2e0->_M_local_buf[lVar6];
        lVar14 = 1;
        if (cVar4 == '\"') {
LAB_0016382f:
          cVar4 = local_2e0->_M_local_buf[lVar6];
          while (lVar7 = std::__cxx11::string::find
                                   ((char)(string *)&local_2e0,(ulong)(uint)(int)cVar4), lVar7 != -1
                ) {
            if (local_2e0->_M_local_buf[lVar7 + -1] != '\\') {
              lVar14 = lVar7 - lVar6;
              break;
            }
            std::__cxx11::string::erase((ulong)&local_2e0,lVar7 - 1);
            cVar4 = local_2e0->_M_local_buf[lVar6];
          }
        }
        else {
          if (cVar4 == '#') goto LAB_001637b1;
          if (cVar4 == '\'') goto LAB_0016382f;
        }
        lVar6 = std::__cxx11::string::find_first_of((char *)&local_2e0,0x1832b2,lVar14 + lVar6);
        if (lVar6 == -1) {
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_328,local_2e0,(char *)(local_2d8 + (long)local_2e0));
          std::__cxx11::string::append((char *)&local_328);
          std::__cxx11::string::_M_append((char *)local_2e8,(ulong)local_328._M_dataplus._M_p);
        }
        else {
          if (lVar6 == local_2d8 + -1) {
            local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_328,local_2e0,(char *)(local_2d8 + (long)local_2e0));
            std::__cxx11::string::append((char *)&local_328);
            std::__cxx11::string::_M_append((char *)local_2e8,(ulong)local_328._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p != &local_328.field_2) {
              operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1
                             );
            }
          }
          uVar15 = 1;
          if (1 < (byte)(local_2e0->_M_local_buf[lVar6 + 1] - 0x3dU)) {
            uVar15 = (ulong)(local_2e0->_M_local_buf[lVar6 + -1] == '<');
            if (local_2e0->_M_local_buf[lVar6 + -1] == '<') {
              lVar6 = lVar6 + -1;
            }
          }
          std::__cxx11::string::substr((ulong)&local_328,(ulong)&local_2e0);
          while (local_328._M_dataplus._M_p[local_328._M_string_length - 1] == ' ') {
            std::__cxx11::string::pop_back();
          }
          cVar4 = *local_328._M_dataplus._M_p;
          if (((cVar4 == '\'') || (cVar4 == '\"')) &&
             (local_328._M_dataplus._M_p[local_328._M_string_length - 1] == cVar4)) {
            std::__cxx11::string::pop_back();
            std::__cxx11::string::_M_erase((ulong)&local_328,0);
          }
          if (local_328._M_string_length == 0) {
            local_308 = local_2f8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_308,local_2e0,(char *)(local_2d8 + (long)local_2e0));
            std::__cxx11::string::append((char *)&local_308);
            std::__cxx11::string::_M_append((char *)local_2e8,(ulong)local_308);
          }
          else {
            lVar14 = std::__cxx11::string::find_first_not_of
                               ((char *)&local_2e0,0x18332b,uVar15 + lVar6 + 1);
            if (lVar14 == -1) {
              local_308 = local_2f8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_308,local_2e0,(char *)(local_2d8 + (long)local_2e0));
              std::__cxx11::string::append((char *)&local_308);
              std::__cxx11::string::_M_append((char *)local_2e8,(ulong)local_308);
            }
            else {
              std::__cxx11::string::substr((ulong)&local_308,(ulong)&local_2e0);
              cVar4 = *(char *)((long)local_308 + local_300 + -1);
              while (cVar4 == ' ') {
                std::__cxx11::string::pop_back();
                cVar4 = *(char *)((long)local_308 + local_300 + -1);
              }
              cVar1 = (char)*local_308;
              if (((cVar1 == '\'') || (cVar1 == '\"')) && (cVar4 == cVar1)) {
                std::__cxx11::string::pop_back();
                std::__cxx11::string::_M_erase((ulong)&local_308,0);
              }
              local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_290,local_308,(char *)((long)local_308 + local_300));
              measurement_from_string(&local_250,&local_290,defaultMatchFlags);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290._M_dataplus._M_p != &local_290.field_2) {
                operator_delete(local_290._M_dataplus._M_p,
                                local_290.field_2._M_allocated_capacity + 1);
              }
              uVar2 = local_250.units_._8_8_;
              local_2a0 = local_250.units_.multiplier_;
              if ((((local_250.units_._8_8_ & 0xffffffff) == 0xfa94a488 &&
                    NAN(local_250.units_.multiplier_)) || (NAN(local_250.units_.multiplier_))) ||
                 ((local_250.units_.base_units_ == -0x56b5b78 ||
                  (local_298 = local_250.value_, NAN(local_250.value_))))) {
                std::__cxx11::string::substr((ulong)local_270,(ulong)&local_2e0);
                plVar9 = (long *)std::__cxx11::string::append((char *)local_270);
                plVar11 = plVar9 + 2;
                if ((long *)*plVar9 == plVar11) {
                  local_2b0 = *plVar11;
                  lStack_2a8 = plVar9[3];
                  local_2c0.multiplier_ = (double)&local_2b0;
                }
                else {
                  local_2b0 = *plVar11;
                  local_2c0.multiplier_ = (double)*plVar9;
                }
                local_2c0._8_8_ = plVar9[1];
                *plVar9 = (long)plVar11;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_2e8,(ulong)local_2c0.multiplier_);
                if ((long *)local_2c0.multiplier_ != &local_2b0) {
                  operator_delete((void *)local_2c0.multiplier_,local_2b0 + 1);
                }
                if (local_270[0] != local_260) {
                  operator_delete(local_270[0],local_260[0] + 1);
                }
              }
              else if (local_2e0->_M_local_buf[uVar15 + lVar6] == '>') {
                if ((_ZN5unitsL21allowUserDefinedUnitsE_0 & 1) != 0) {
                  pmVar8 = std::__detail::
                           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                         *)user_defined_units_abi_cxx11_,&local_328);
                  uVar3 = local_250.units_._8_8_;
                  pmVar8->multiplier_ = local_2a0 * local_298;
                  local_250.units_.base_units_ = SUB84(uVar2,0);
                  local_250.units_.commodity_ = SUB84(uVar2,4);
                  pmVar8->base_units_ = local_250.units_.base_units_;
                  pmVar8->commodity_ = local_250.units_.commodity_;
                  _ZN5unitsL21allowUserDefinedUnitsE_0 = _ZN5unitsL21allowUserDefinedUnitsE_0 & 1;
                  local_250.units_._8_8_ = uVar3;
                }
              }
              else {
                local_2c0.multiplier_ = local_250.units_.multiplier_ * local_250.value_;
                if (local_2e0->_M_local_buf[lVar6] == '<') {
                  local_2c0.base_units_ = local_250.units_.base_units_;
                  local_2c0.commodity_ = local_250.units_.commodity_;
                  addUserDefinedOutputUnit(&local_328,&local_2c0);
                }
                else {
                  local_2c0.base_units_ = local_250.units_.base_units_;
                  local_2c0.commodity_ = local_250.units_.commodity_;
                  addUserDefinedUnit(&local_328,&local_2c0);
                }
              }
            }
          }
          if (local_308 != local_2f8) {
            operator_delete(local_308,local_2f8[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
      }
    } while( true );
  }
  std::operator+(&local_328,"unable to read file ",filename);
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_328);
  puVar12 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_2d0._M_allocated_capacity = *puVar12;
    local_2d0._8_8_ = puVar10[3];
    local_2e0 = &local_2d0;
  }
  else {
    local_2d0._M_allocated_capacity = *puVar12;
    local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10;
  }
  local_2d8 = puVar10[1];
  *puVar10 = puVar12;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  std::__cxx11::string::operator=((string *)local_2e8,(string *)&local_2e0);
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,local_2d0._M_allocated_capacity + 1);
  }
  _Var13._M_p = local_328._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p == &local_328.field_2) goto LAB_00163e60;
LAB_00163e58:
  operator_delete(_Var13._M_p,local_328.field_2._M_allocated_capacity + 1);
LAB_00163e60:
  std::ifstream::~ifstream(local_238);
  return local_2e8;
LAB_00163de8:
  local_328.field_2._M_allocated_capacity = local_2d0._M_allocated_capacity;
  _Var13._M_p = (pointer)local_2e0;
  if (local_2e0 == &local_2d0) goto LAB_00163e60;
  goto LAB_00163e58;
}

Assistant:

std::string definedUnitsFromFile(const std::string& filename) noexcept
{
    std::string output;
    try {
        std::ifstream infile(filename);
        if (!infile.is_open()) {
            output = "unable to read file " + filename + "\n";
            return output;
        }
        std::string line;
        while (std::getline(infile, line)) {
            auto commentloc = line.find_first_not_of(" \t\n");
            if (commentloc == std::string::npos || line[commentloc] == '#') {
                continue;
            }
            std::size_t esep{1};  // extra separation location to handle quotes
            if (line[commentloc] == '\"' || line[commentloc] == '\'') {
                bool notfound{true};
                while (notfound) {
                    esep =
                        line.find_first_of(line[commentloc], commentloc + esep);
                    if (esep == std::string::npos) {
                        esep = 1;
                        break;
                    }
                    if (line[esep - 1] != '\\') {
                        notfound = false;
                    } else {
                        // remove the escaped quote
                        line.erase(esep - 1, 1);
                    }
                    esep -= commentloc;
                }
            }
            auto sep = line.find_first_of(",;=", commentloc + esep);
            if (sep == std::string::npos) {
                output +=
                    line + " is not a valid user defined unit definition\n";
                continue;
            }
            if (sep == line.size() - 1) {
                output += line + " does not have any valid definitions\n";
            }
            int length{0};
            if (line[sep + 1] == '=' || line[sep + 1] == '>') {
                length = 1;
            }
            if (length == 0 && line[sep - 1] == '<') {
                length = 1;
                --sep;
            }
            // get the new definition name
            std::string userdef = line.substr(commentloc, sep - commentloc);
            while (userdef.back() == ' ') {
                userdef.pop_back();
            }
            // remove quotes
            if ((userdef.front() == '\"' || userdef.front() == '\'') &&
                userdef.back() == userdef.front()) {
                userdef.pop_back();
                userdef.erase(userdef.begin());
            }
            if (userdef.empty()) {
                output += line + " does not specify a user string\n";
                continue;
            }
            // the unit string
            auto sloc = line.find_first_not_of(" \t", sep + length + 1);
            if (sloc == std::string::npos) {
                output += line + " does not specify a unit definition string\n";
                continue;
            }
            auto meas_string = line.substr(sloc);
            while (meas_string.back() == ' ') {
                meas_string.pop_back();
            }
            if ((meas_string.front() == '\"' || meas_string.front() == '\'') &&
                meas_string.back() == meas_string.front()) {
                meas_string.pop_back();
                meas_string.erase(meas_string.begin());
            }
            auto meas = measurement_from_string(meas_string);
            if (!is_valid(meas)) {
                output +=
                    line.substr(sloc) + " does not generate a valid unit\n";
                continue;
            }

            if (line[sep + length] == '>') {
                addUserDefinedInputUnit(userdef, meas.as_unit());
            } else if (line[sep] == '<') {
                addUserDefinedOutputUnit(userdef, meas.as_unit());
            } else {
                addUserDefinedUnit(userdef, meas.as_unit());
            }
        }
    }
    // LCOV_EXCL_START
    catch (const std::exception& e) {
        output += e.what();
        output.push_back('\n');
        // this is mainly just to catch any weird errors coming from somewhere
        // so this function can be noexcept
    }
    // LCOV_EXCL_STOP
    return output;
}